

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceArrayIntersectorK<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  NodeRef *pNVar5;
  NodeRef *pNVar6;
  NodeRef *pNVar7;
  int iVar8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar20;
  NodeRef NVar21;
  size_t sVar22;
  size_t sVar23;
  long lVar24;
  NodeRef *pNVar25;
  size_t sVar26;
  ulong uVar27;
  ulong uVar28;
  NodeRef nodeRef;
  Primitive_conflict4 *pPVar29;
  size_t sVar30;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar31;
  bool bVar32;
  byte bVar33;
  byte bVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar86;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar91 [64];
  undefined4 uVar92;
  undefined4 uVar98;
  undefined4 uVar99;
  vint4 ai_2;
  undefined1 auVar94 [16];
  undefined4 uVar100;
  undefined1 auVar95 [16];
  undefined4 uVar101;
  undefined4 uVar102;
  vint4 ai;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  float fVar108;
  vint4 ai_1;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  vint4 ai_3;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  vint4 bi;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  vint4 bi_1;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  vint4 bi_3;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined4 uVar123;
  vint4 bi_2;
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  int in_XMM11_Da;
  int in_XMM11_Db;
  int in_XMM11_Dc;
  int in_XMM11_Dd;
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [64];
  float fVar130;
  float fVar132;
  vint4 bi_8;
  undefined1 auVar131 [64];
  float fVar133;
  float fVar136;
  undefined1 auVar135 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  vbool<4>_conflict valid_leaf;
  Precalculations pre;
  int local_3528;
  int iStack_3524;
  int iStack_3520;
  int iStack_351c;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar50 [16];
  undefined1 auVar72 [16];
  undefined8 uVar93;
  undefined1 auVar150 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar134 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar45 = in_ZMM0._0_16_;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar45 = vpcmpeqd_avx(auVar45,auVar45);
      uVar35 = vpcmpeqd_avx512vl(auVar45,(undefined1  [16])valid_i->field_0);
      stack_node[0x1ce].ptr = uVar35 & 0xf;
      if ((byte)stack_node[0x1ce].ptr != 0) {
        stack_node[0x1cd].ptr = (size_t)This->ptr;
        auVar43 = *(undefined1 (*) [16])(ray + 0x20);
        auVar54 = *(undefined1 (*) [16])(ray + 0x40);
        auVar69._8_4_ = 0x7fffffff;
        auVar69._0_8_ = 0x7fffffff7fffffff;
        auVar69._12_4_ = 0x7fffffff;
        auVar44 = vandps_avx(auVar54,auVar69);
        auVar47._8_4_ = 0x219392ef;
        auVar47._0_8_ = 0x219392ef219392ef;
        auVar47._12_4_ = 0x219392ef;
        uVar35 = vcmpps_avx512vl(auVar44,auVar47,1);
        auVar44 = *(undefined1 (*) [16])(ray + 0x50);
        auVar39 = vblendmps_avx512vl(auVar54,auVar47);
        bVar10 = (bool)((byte)uVar35 & 1);
        auVar41._0_4_ = (uint)bVar10 * auVar39._0_4_ | (uint)!bVar10 * in_XMM11_Da;
        bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * in_XMM11_Db;
        bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * in_XMM11_Dc;
        bVar10 = (bool)((byte)(uVar35 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * in_XMM11_Dd;
        auVar39 = vandps_avx(auVar44,auVar69);
        uVar35 = vcmpps_avx512vl(auVar39,auVar47,1);
        bVar10 = (bool)((byte)uVar35 & 1);
        auVar52._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._0_4_;
        bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._4_4_;
        bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._8_4_;
        bVar10 = (bool)((byte)(uVar35 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._12_4_;
        auVar44 = *(undefined1 (*) [16])(ray + 0x60);
        auVar39 = vandps_avx(auVar44,auVar69);
        uVar35 = vcmpps_avx512vl(auVar39,auVar47,1);
        bVar10 = (bool)((byte)uVar35 & 1);
        auVar53._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._0_4_;
        bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._4_4_;
        bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._8_4_;
        bVar10 = (bool)((byte)(uVar35 >> 3) & 1);
        auVar53._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar44._12_4_;
        auVar39 = vrcp14ps_avx512vl(auVar41);
        auVar46._8_4_ = 0x3f800000;
        auVar46._0_8_ = &DAT_3f8000003f800000;
        auVar46._12_4_ = 0x3f800000;
        auVar69 = ZEXT816(0) << 0x40;
        auVar44 = vfnmadd213ps_fma(auVar41,auVar39,auVar46);
        auVar39 = vfmadd132ps_fma(auVar44,auVar39,auVar39);
        auVar125 = ZEXT1664(auVar39);
        auVar41 = vrcp14ps_avx512vl(auVar52);
        auVar44 = vfnmadd213ps_fma(auVar52,auVar41,auVar46);
        auVar41 = vfmadd132ps_fma(auVar44,auVar41,auVar41);
        auVar124 = ZEXT1664(auVar41);
        auVar52 = vrcp14ps_avx512vl(auVar53);
        auVar44 = vfnmadd213ps_fma(auVar53,auVar52,auVar46);
        auVar52 = vfmadd132ps_fma(auVar44,auVar52,auVar52);
        auVar126 = ZEXT1664(auVar52);
        auVar54 = vcmpps_avx(auVar54,auVar69,1);
        auVar44._8_4_ = 1;
        auVar44._0_8_ = 0x100000001;
        auVar44._12_4_ = 1;
        auVar53 = vandps_avx512vl(auVar54,auVar44);
        uVar35 = vcmpps_avx512vl(auVar69,*(undefined1 (*) [16])(ray + 0x50),0xe);
        auVar48._8_4_ = 2;
        auVar48._0_8_ = 0x200000002;
        auVar48._12_4_ = 2;
        auVar44 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar69);
        stack_node[0x1e5].ptr = auVar44._0_8_;
        stack_node[0x1e6].ptr = auVar44._8_8_;
        auVar54 = vpsubd_avx512vl(auVar48,auVar54);
        bVar10 = (bool)((byte)uVar35 & 1);
        auVar50._0_4_ = (uint)bVar10 * auVar54._0_4_ | (uint)!bVar10 * auVar53._0_4_;
        bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar10 * auVar54._4_4_ | (uint)!bVar10 * auVar53._4_4_;
        bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar10 * auVar54._8_4_ | (uint)!bVar10 * auVar53._8_4_;
        bVar10 = (bool)((byte)(uVar35 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar10 * auVar54._12_4_ | (uint)!bVar10 * auVar53._12_4_;
        uVar35 = vcmpps_avx512vl(auVar69,*(undefined1 (*) [16])(ray + 0x60),0xe);
        auVar54._8_4_ = 4;
        auVar54._0_8_ = 0x400000004;
        auVar54._12_4_ = 4;
        auVar54 = vpord_avx512vl(auVar50,auVar54);
        bVar10 = (bool)((byte)uVar35 & 1);
        auVar67._0_4_ = (uint)bVar10 * auVar54._0_4_ | !bVar10 * auVar50._0_4_;
        bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
        auVar67._4_4_ = (uint)bVar10 * auVar54._4_4_ | !bVar10 * auVar50._4_4_;
        bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
        auVar67._8_4_ = (uint)bVar10 * auVar54._8_4_ | !bVar10 * auVar50._8_4_;
        bVar10 = (bool)((byte)(uVar35 >> 3) & 1);
        auVar67._12_4_ = (uint)bVar10 * auVar54._12_4_ | !bVar10 * auVar50._12_4_;
        auVar54 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar69);
        stack_node[0x1e3].ptr = auVar54._0_8_;
        stack_node[0x1e4].ptr = auVar54._8_8_;
        auVar54 = vmovdqa32_avx512vl(auVar67);
        bVar10 = (bool)((byte)stack_node[0x1ce].ptr & 1);
        bVar32 = (bool)((byte)(stack_node[0x1ce].ptr >> 1) & 1);
        bVar12 = (bool)((byte)(stack_node[0x1ce].ptr >> 2) & 1);
        bVar13 = SUB81(stack_node[0x1ce].ptr >> 3,0);
        stack_node[0x1e1].ptr._0_4_ = (uint)bVar10 * auVar54._0_4_ | (uint)!bVar10 * auVar45._0_4_;
        stack_node[0x1e1].ptr._4_4_ = (uint)bVar32 * auVar54._4_4_ | (uint)!bVar32 * auVar45._4_4_;
        stack_node[0x1e2].ptr._0_4_ = (uint)bVar12 * auVar54._8_4_ | (uint)!bVar12 * auVar45._8_4_;
        stack_node[0x1e2].ptr._4_4_ = (uint)bVar13 * auVar54._12_4_ | (uint)!bVar13 * auVar45._12_4_
        ;
        stack_node[0x1eb].ptr._0_4_ = *(float *)ray;
        stack_node[0x1eb].ptr._4_4_ = *(float *)(ray + 4);
        stack_node[0x1ec].ptr._0_4_ = *(float *)(ray + 8);
        stack_node[0x1ec].ptr._4_4_ = *(float *)(ray + 0xc);
        fVar130 = auVar39._0_4_ * -*(float *)ray;
        fVar132 = auVar39._4_4_ * -*(float *)(ray + 4);
        auVar49._0_8_ = CONCAT44(fVar132,fVar130);
        auVar49._8_4_ = auVar39._8_4_ * -*(float *)(ray + 8);
        auVar49._12_4_ = auVar39._12_4_ * -*(float *)(ray + 0xc);
        auVar127 = ZEXT1664(auVar49);
        stack_node[0x1e9].ptr._0_4_ = *(float *)(ray + 0x10);
        stack_node[0x1e9].ptr._4_4_ = *(float *)(ray + 0x14);
        stack_node[0x1ea].ptr._0_4_ = *(float *)(ray + 0x18);
        stack_node[0x1ea].ptr._4_4_ = *(float *)(ray + 0x1c);
        fVar133 = auVar41._0_4_ * -*(float *)(ray + 0x10);
        fVar136 = auVar41._4_4_ * -*(float *)(ray + 0x14);
        auVar134._0_8_ = CONCAT44(fVar136,fVar133);
        auVar134._8_4_ = auVar41._8_4_ * -*(float *)(ray + 0x18);
        auVar134._12_4_ = auVar41._12_4_ * -*(float *)(ray + 0x1c);
        auVar129 = ZEXT1664(auVar134);
        stack_node[0x1e7].ptr = auVar43._0_8_;
        stack_node[0x1e8].ptr = auVar43._8_8_;
        auVar45._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
        auVar45._8_4_ = auVar43._8_4_ ^ 0x80000000;
        auVar45._12_4_ = auVar43._12_4_ ^ 0x80000000;
        auVar45 = vmulps_avx512vl(auVar52,auVar45);
        auVar131 = ZEXT1664(auVar45);
        auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar135 = ZEXT1664(auVar43);
        stack_node[0x1c2].ptr = 8;
        stack_node[0x1d0].ptr = (size_t)context;
        stack_node[0x1cf].ptr = (size_t)ray;
        stack_node[0x1df].ptr = auVar41._0_8_;
        stack_node[0x1e0].ptr = auVar41._8_8_;
        stack_node[0x1dd].ptr = auVar39._0_8_;
        stack_node[0x1de].ptr = auVar39._8_8_;
        stack_node[0x1db].ptr = auVar52._0_8_;
        stack_node[0x1dc].ptr = auVar52._8_8_;
        stack_node[0x1d9].ptr = auVar49._0_8_;
        stack_node[0x1da].ptr = auVar49._8_8_;
        stack_node[0x1d7].ptr = auVar134._0_8_;
        stack_node[0x1d8].ptr = auVar134._8_8_;
        stack_node[0x1d5].ptr = auVar45._0_8_;
        stack_node[0x1d6].ptr = auVar45._8_8_;
        do {
          lVar24 = 0;
          for (uVar35 = stack_node[0x1ce].ptr; (uVar35 & 1) == 0;
              uVar35 = uVar35 >> 1 | 0x8000000000000000) {
            lVar24 = lVar24 + 1;
          }
          iVar8 = *(int *)((long)&stack_node[0x1e1].ptr + lVar24 * 4);
          auVar89._4_4_ = iVar8;
          auVar89._0_4_ = iVar8;
          auVar89._8_4_ = iVar8;
          auVar89._12_4_ = iVar8;
          auVar43._4_4_ = stack_node[0x1e1].ptr._4_4_;
          auVar43._0_4_ = (uint)stack_node[0x1e1].ptr;
          auVar43._8_4_ = (uint)stack_node[0x1e2].ptr;
          auVar43._12_4_ = stack_node[0x1e2].ptr._4_4_;
          uVar28 = vpcmpeqd_avx512vl(auVar89,auVar43);
          uVar28 = uVar28 & 0xf;
          bVar34 = (byte)uVar28;
          stack_node[0x1ce].ptr = (long)(char)~bVar34 & stack_node[0x1ce].ptr;
          auVar50 = auVar135._0_16_;
          auVar45 = vblendmps_avx512vl(auVar50,auVar125._0_16_);
          auVar39._0_4_ = (uint)(bVar34 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar34 & 1) * iVar8;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar39._4_4_ = (uint)bVar10 * auVar45._4_4_ | (uint)!bVar10 * iVar8;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar39._8_4_ = (uint)bVar10 * auVar45._8_4_ | (uint)!bVar10 * iVar8;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar39._12_4_ = (uint)bVar10 * auVar45._12_4_ | (uint)!bVar10 * iVar8;
          auVar45 = vshufps_avx(auVar39,auVar39,0xb1);
          auVar45 = vminps_avx(auVar45,auVar39);
          auVar43 = vshufpd_avx(auVar45,auVar45,1);
          auVar45 = vminps_avx(auVar43,auVar45);
          auVar54 = vblendmps_avx512vl(auVar50,auVar124._0_16_);
          auVar55._0_4_ =
               (uint)(bVar34 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar43._0_4_;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar55._4_4_ = (uint)bVar10 * auVar54._4_4_ | (uint)!bVar10 * auVar43._4_4_;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar55._8_4_ = (uint)bVar10 * auVar54._8_4_ | (uint)!bVar10 * auVar43._8_4_;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar55._12_4_ = (uint)bVar10 * auVar54._12_4_ | (uint)!bVar10 * auVar43._12_4_;
          auVar43 = vshufps_avx(auVar55,auVar55,0xb1);
          auVar43 = vminps_avx(auVar43,auVar55);
          auVar54 = vshufpd_avx(auVar43,auVar43,1);
          auVar43 = vminps_avx(auVar54,auVar43);
          auVar45 = vinsertps_avx(auVar45,auVar43,0x1c);
          auVar54 = vblendmps_avx512vl(auVar50,auVar126._0_16_);
          auVar56._0_4_ =
               (uint)(bVar34 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar43._0_4_;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar56._4_4_ = (uint)bVar10 * auVar54._4_4_ | (uint)!bVar10 * auVar43._4_4_;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar56._8_4_ = (uint)bVar10 * auVar54._8_4_ | (uint)!bVar10 * auVar43._8_4_;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar56._12_4_ = (uint)bVar10 * auVar54._12_4_ | (uint)!bVar10 * auVar43._12_4_;
          auVar43 = vshufps_avx(auVar56,auVar56,0xb1);
          auVar43 = vminps_avx(auVar43,auVar56);
          auVar54 = vshufpd_avx(auVar43,auVar43,1);
          auVar43 = vminps_avx(auVar54,auVar43);
          auVar45 = vinsertps_avx(auVar45,auVar43,0x20);
          auVar128._8_4_ = 0xff800000;
          auVar128._0_8_ = 0xff800000ff800000;
          auVar128._12_4_ = 0xff800000;
          auVar54 = vblendmps_avx512vl(auVar128,auVar125._0_16_);
          auVar57._0_4_ =
               (uint)(bVar34 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar43._0_4_;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar57._4_4_ = (uint)bVar10 * auVar54._4_4_ | (uint)!bVar10 * auVar43._4_4_;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar57._8_4_ = (uint)bVar10 * auVar54._8_4_ | (uint)!bVar10 * auVar43._8_4_;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar57._12_4_ = (uint)bVar10 * auVar54._12_4_ | (uint)!bVar10 * auVar43._12_4_;
          auVar43 = vshufps_avx(auVar57,auVar57,0xb1);
          auVar43 = vmaxps_avx(auVar43,auVar57);
          auVar54 = vshufpd_avx(auVar43,auVar43,1);
          auVar43 = vmaxps_avx(auVar54,auVar43);
          auVar44 = vblendmps_avx512vl(auVar128,auVar124._0_16_);
          auVar58._0_4_ =
               (uint)(bVar34 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar54._0_4_;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar58._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar54._4_4_;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar58._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * auVar54._8_4_;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar58._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * auVar54._12_4_;
          auVar54 = vshufps_avx(auVar58,auVar58,0xb1);
          auVar54 = vmaxps_avx(auVar54,auVar58);
          auVar44 = vshufpd_avx(auVar54,auVar54,1);
          auVar54 = vmaxps_avx(auVar44,auVar54);
          auVar43 = vinsertps_avx(auVar43,auVar54,0x1c);
          auVar44 = vblendmps_avx512vl(auVar128,auVar126._0_16_);
          auVar59._0_4_ =
               (uint)(bVar34 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar54._0_4_;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar59._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar54._4_4_;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar59._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * auVar54._8_4_;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar59._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * auVar54._12_4_;
          auVar54 = vshufps_avx(auVar59,auVar59,0xb1);
          auVar54 = vmaxps_avx(auVar54,auVar59);
          auVar44 = vshufpd_avx(auVar54,auVar54,1);
          auVar54 = vmaxps_avx(auVar44,auVar54);
          auVar43 = vinsertps_avx(auVar43,auVar54,0x20);
          uVar35 = vcmpps_avx512vl(auVar45,ZEXT816(0) << 0x20,5);
          auVar54 = vblendmps_avx512vl(auVar43,auVar45);
          bVar33 = (byte)uVar35;
          fVar1 = (float)((uint)(bVar33 & 1) * auVar54._0_4_);
          fVar2 = (float)((uint)((byte)(uVar35 >> 1) & 1) * auVar54._4_4_);
          auVar60._4_4_ = fVar2;
          auVar60._0_4_ = fVar1;
          fVar3 = (float)((uint)((byte)(uVar35 >> 2) & 1) * auVar54._8_4_);
          auVar60._8_4_ = fVar3;
          fVar4 = (float)((uint)((byte)(uVar35 >> 3) & 1) * auVar54._12_4_);
          auVar60._12_4_ = fVar4;
          auVar52 = vmovshdup_avx(auVar60);
          stack_node[0x1d4].ptr = (ulong)(auVar52._0_4_ < 0.0) << 5 | 0x40;
          auVar54 = vshufpd_avx(auVar60,auVar60,1);
          uVar36 = (ulong)(auVar54._0_4_ < 0.0) << 5 | 0x80;
          stack_node[0x1d3].ptr = stack_node[0x1d4].ptr ^ 0x20;
          auVar19._4_4_ = stack_node[0x1eb].ptr._4_4_;
          auVar19._0_4_ = (float)stack_node[0x1eb].ptr;
          auVar19._8_4_ = (float)stack_node[0x1ec].ptr;
          auVar19._12_4_ = stack_node[0x1ec].ptr._4_4_;
          auVar44 = vblendmps_avx512vl(auVar50,auVar19);
          auVar61._0_4_ =
               (uint)(bVar34 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar34 & 1) * (int)auVar54._0_4_;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar61._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar54._4_4_;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar61._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * auVar54._8_4_;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar61._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * auVar54._12_4_;
          auVar54 = vshufps_avx(auVar61,auVar61,0xb1);
          auVar54 = vminps_avx(auVar54,auVar61);
          auVar44 = vshufpd_avx(auVar54,auVar54,1);
          auVar54 = vminps_avx(auVar44,auVar54);
          auVar18._4_4_ = stack_node[0x1e9].ptr._4_4_;
          auVar18._0_4_ = (float)stack_node[0x1e9].ptr;
          auVar18._8_4_ = (float)stack_node[0x1ea].ptr;
          auVar18._12_4_ = stack_node[0x1ea].ptr._4_4_;
          auVar39 = vblendmps_avx512vl(auVar50,auVar18);
          auVar62._0_4_ =
               (uint)(bVar34 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar44._0_4_;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar62._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar44._4_4_;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar62._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar44._8_4_;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar62._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar44._12_4_;
          auVar44 = vshufps_avx(auVar62,auVar62,0xb1);
          auVar44 = vminps_avx(auVar44,auVar62);
          auVar39 = vshufpd_avx(auVar44,auVar44,1);
          auVar44 = vminps_avx(auVar39,auVar44);
          auVar54 = vinsertps_avx(auVar54,auVar44,0x1c);
          auVar39 = vblendmps_avx512vl(auVar50,stack_node._3896_16_);
          auVar63._0_4_ =
               (uint)(bVar34 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar44._0_4_;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar63._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar44._4_4_;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar63._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar44._8_4_;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar63._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar44._12_4_;
          auVar44 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar44 = vminps_avx(auVar44,auVar63);
          auVar39 = vshufpd_avx(auVar44,auVar44,1);
          auVar44 = vminps_avx(auVar39,auVar44);
          auVar54 = vinsertps_avx(auVar54,auVar44,0x20);
          auVar39 = vblendmps_avx512vl(auVar128,auVar19);
          auVar64._0_4_ =
               (uint)(bVar34 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar44._0_4_;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar64._4_4_ = (uint)bVar10 * auVar39._4_4_ | (uint)!bVar10 * auVar44._4_4_;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar64._8_4_ = (uint)bVar10 * auVar39._8_4_ | (uint)!bVar10 * auVar44._8_4_;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar64._12_4_ = (uint)bVar10 * auVar39._12_4_ | (uint)!bVar10 * auVar44._12_4_;
          auVar44 = vshufps_avx(auVar64,auVar64,0xb1);
          auVar44 = vmaxps_avx(auVar44,auVar64);
          auVar39 = vshufpd_avx(auVar44,auVar44,1);
          auVar44 = vmaxps_avx(auVar39,auVar44);
          auVar41 = vblendmps_avx512vl(auVar128,auVar18);
          auVar65._0_4_ =
               (uint)(bVar34 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar39._0_4_;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar65._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar39._4_4_;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar65._8_4_ = (uint)bVar10 * auVar41._8_4_ | (uint)!bVar10 * auVar39._8_4_;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar65._12_4_ = (uint)bVar10 * auVar41._12_4_ | (uint)!bVar10 * auVar39._12_4_;
          auVar39 = vshufps_avx(auVar65,auVar65,0xb1);
          auVar39 = vmaxps_avx(auVar39,auVar65);
          auVar41 = vshufpd_avx(auVar39,auVar39,1);
          auVar39 = vmaxps_avx(auVar41,auVar39);
          auVar44 = vinsertps_avx(auVar44,auVar39,0x1c);
          auVar41 = vblendmps_avx512vl(auVar128,stack_node._3896_16_);
          auVar66._0_4_ =
               (uint)(bVar34 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar34 & 1) * auVar39._0_4_;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar66._4_4_ = (uint)bVar10 * auVar41._4_4_ | (uint)!bVar10 * auVar39._4_4_;
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar66._8_4_ = (uint)bVar10 * auVar41._8_4_ | (uint)!bVar10 * auVar39._8_4_;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar66._12_4_ = (uint)bVar10 * auVar41._12_4_ | (uint)!bVar10 * auVar39._12_4_;
          auVar39 = vshufps_avx(auVar66,auVar66,0xb1);
          auVar39 = vmaxps_avx(auVar39,auVar66);
          auVar41 = vshufpd_avx(auVar39,auVar39,1);
          auVar39 = vmaxps_avx(auVar41,auVar39);
          auVar44 = vinsertps_avx(auVar44,auVar39,0x20);
          auVar67 = vblendmps_avx512vl(auVar44,auVar54);
          bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar35 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar35 >> 3) & 1);
          bVar32 = (bool)((byte)(uVar35 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar35 >> 3) & 1);
          auVar41 = vblendmps_avx512vl(auVar128,stack_node._3864_16_);
          auVar68._0_4_ =
               (uint)(bVar34 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar34 & 1) * in_ZMM18._0_4_;
          bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar68._4_4_ = (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * in_ZMM18._4_4_;
          bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar68._8_4_ = (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * in_ZMM18._8_4_;
          bVar12 = SUB81(uVar28 >> 3,0);
          auVar68._12_4_ = (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * in_ZMM18._12_4_;
          in_ZMM18 = ZEXT1664(auVar68);
          auVar41 = vshufps_avx512vl(auVar68,auVar68,0xb1);
          auVar69 = vmaxps_avx512vl(auVar41,auVar68);
          auVar53 = vshufpd_avx(auVar69,auVar69,1);
          auVar41 = vblendmps_avx512vl(auVar50,stack_node._3880_16_);
          auVar70._0_4_ =
               (uint)(bVar34 & 1) * auVar41._0_4_ |
               (uint)!(bool)(bVar34 & 1) * (int)(float)stack_node[0x1e9].ptr;
          bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
          auVar70._4_4_ =
               (uint)bVar12 * auVar41._4_4_ | (uint)!bVar12 * (int)stack_node[0x1e9].ptr._4_4_;
          bVar12 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar70._8_4_ =
               (uint)bVar12 * auVar41._8_4_ | (uint)!bVar12 * (int)(float)stack_node[0x1ea].ptr;
          bVar12 = SUB81(uVar28 >> 3,0);
          auVar70._12_4_ =
               (uint)bVar12 * auVar41._12_4_ | (uint)!bVar12 * (int)stack_node[0x1ea].ptr._4_4_;
          auVar41 = vshufps_avx(auVar70,auVar70,0xb1);
          auVar41 = vminps_avx(auVar41,auVar70);
          auVar50 = vshufpd_avx(auVar41,auVar41,1);
          auVar41 = vminps_avx(auVar50,auVar41);
          auVar53 = vmaxss_avx512f(auVar53,auVar69);
          auVar138 = ZEXT1664(auVar53);
          auVar71._0_4_ =
               (float)((uint)(bVar33 & 1) * auVar43._0_4_ |
                      (uint)!(bool)(bVar33 & 1) * auVar45._0_4_);
          bVar12 = (bool)((byte)(uVar35 >> 1) & 1);
          auVar71._4_4_ = (float)((uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * auVar45._4_4_);
          bVar12 = (bool)((byte)(uVar35 >> 2) & 1);
          auVar71._8_4_ = (float)((uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * auVar45._8_4_);
          bVar12 = (bool)((byte)(uVar35 >> 3) & 1);
          auVar71._12_4_ = (float)((uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * auVar45._12_4_);
          fVar108 = (float)((uint)(bVar33 & 1) * auVar44._0_4_ |
                           (uint)!(bool)(bVar33 & 1) * auVar54._0_4_) * fVar1;
          fVar111 = (float)((uint)(bVar33 & 1) * auVar67._0_4_ |
                           (uint)!(bool)(bVar33 & 1) * auVar39._0_4_) * auVar71._0_4_;
          uVar35 = (ulong)(fVar1 < 0.0) << 5;
          stack_node[0x1d2].ptr = uVar35;
          stack_node[0x227].ptr = *(size_t *)(stack_node[0x1cd].ptr + 0x70);
          stack_node[0x228].ptr._0_4_ = 0;
          auVar74 = vbroadcastss_avx512vl(auVar60);
          auVar91 = ZEXT3264(auVar74);
          auVar75._4_4_ = fVar108;
          auVar75._0_4_ = fVar108;
          auVar75._8_4_ = fVar108;
          auVar75._12_4_ = fVar108;
          auVar75._16_4_ = fVar108;
          auVar75._20_4_ = fVar108;
          auVar75._24_4_ = fVar108;
          auVar75._28_4_ = fVar108;
          auVar120._8_4_ = 0x80000000;
          auVar120._0_8_ = 0x8000000080000000;
          auVar120._12_4_ = 0x80000000;
          auVar120._16_4_ = 0x80000000;
          auVar120._20_4_ = 0x80000000;
          auVar120._24_4_ = 0x80000000;
          auVar120._28_4_ = 0x80000000;
          auVar75 = vxorps_avx512vl(auVar75,auVar120);
          auVar139 = ZEXT3264(auVar75);
          auVar76 = vbroadcastsd_avx512vl(auVar52);
          auVar140 = ZEXT3264(auVar76);
          auVar83._8_4_ = 1;
          auVar83._0_8_ = 0x100000001;
          auVar83._12_4_ = 1;
          auVar83._16_4_ = 1;
          auVar83._20_4_ = 1;
          auVar83._24_4_ = 1;
          auVar83._28_4_ = 1;
          auVar79 = ZEXT1632(CONCAT412((float)((uint)bVar15 * auVar44._12_4_ |
                                              (uint)!bVar15 * auVar54._12_4_) * fVar4,
                                       CONCAT48((float)((uint)bVar11 * auVar44._8_4_ |
                                                       (uint)!bVar11 * auVar54._8_4_) * fVar3,
                                                CONCAT44((float)((uint)bVar32 * auVar44._4_4_ |
                                                                (uint)!bVar32 * auVar54._4_4_) *
                                                         fVar2,fVar108))));
          auVar85 = vpermps_avx2(auVar83,auVar79);
          auVar77 = vxorps_avx512vl(auVar85,auVar120);
          auVar141 = ZEXT3264(auVar77);
          auVar107._8_4_ = 2;
          auVar107._0_8_ = 0x200000002;
          auVar107._12_4_ = 2;
          auVar107._16_4_ = 2;
          auVar107._20_4_ = 2;
          auVar107._24_4_ = 2;
          auVar107._28_4_ = 2;
          auVar78 = vpermps_avx512vl(auVar107,ZEXT1632(auVar60));
          auVar142 = ZEXT3264(auVar78);
          auVar85 = vpermps_avx2(auVar107,auVar79);
          auVar79 = vxorps_avx512vl(auVar85,auVar120);
          auVar143 = ZEXT3264(auVar79);
          auVar80 = vbroadcastss_avx512vl(auVar71);
          auVar144 = ZEXT3264(auVar80);
          auVar85._4_4_ = fVar111;
          auVar85._0_4_ = fVar111;
          auVar85._8_4_ = fVar111;
          auVar85._12_4_ = fVar111;
          auVar85._16_4_ = fVar111;
          auVar85._20_4_ = fVar111;
          auVar85._24_4_ = fVar111;
          auVar85._28_4_ = fVar111;
          auVar81 = vxorps_avx512vl(auVar85,auVar120);
          auVar145 = ZEXT3264(auVar81);
          auVar82 = vpermps_avx512vl(auVar83,ZEXT1632(auVar71));
          auVar146 = ZEXT3264(auVar82);
          auVar96 = ZEXT1632(CONCAT412((float)((uint)bVar14 * auVar67._12_4_ |
                                              (uint)!bVar14 * auVar39._12_4_) * auVar71._12_4_,
                                       CONCAT48((float)((uint)bVar13 * auVar67._8_4_ |
                                                       (uint)!bVar13 * auVar39._8_4_) *
                                                auVar71._8_4_,
                                                CONCAT44((float)((uint)bVar10 * auVar67._4_4_ |
                                                                (uint)!bVar10 * auVar39._4_4_) *
                                                         auVar71._4_4_,fVar111))));
          auVar85 = vpermps_avx2(auVar83,auVar96);
          auVar83 = vxorps_avx512vl(auVar85,auVar120);
          auVar147 = ZEXT3264(auVar83);
          auVar84 = vpermps_avx512vl(auVar107,ZEXT1632(auVar71));
          auVar148 = ZEXT3264(auVar84);
          auVar85 = vpermps_avx2(auVar107,auVar96);
          auVar85 = vxorps_avx512vl(auVar85,auVar120);
          auVar149 = ZEXT3264(auVar85);
          uVar123 = auVar41._0_4_;
          uVar98 = uVar123;
          uVar92 = uVar123;
          uVar93 = CONCAT44(uVar98,uVar92);
          uVar99 = uVar123;
          auVar150._8_4_ = uVar99;
          auVar150._0_8_ = uVar93;
          uVar100 = uVar123;
          auVar150._12_4_ = uVar100;
          uVar101 = uVar123;
          auVar96._16_4_ = uVar101;
          auVar96._0_16_ = auVar150;
          uVar102 = uVar123;
          auVar96._20_4_ = uVar102;
          auVar96._24_4_ = uVar123;
          auVar96._28_4_ = uVar123;
          auVar90._8_4_ = 0x7f800000;
          auVar90._0_8_ = 0x7f8000007f800000;
          auVar90._12_4_ = 0x7f800000;
          auVar45 = vpblendmd_avx512vl(auVar90,stack_node._3880_16_);
          uVar37 = (uint)(bVar34 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar34 & 1) * 0x7f800000;
          bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
          uVar86 = (uint)bVar10 * auVar45._4_4_ | (uint)!bVar10 * 0x7f800000;
          auVar72._0_8_ = CONCAT44(uVar86,uVar37);
          bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
          auVar72._8_4_ = (uint)bVar10 * auVar45._8_4_ | (uint)!bVar10 * 0x7f800000;
          bVar10 = SUB81(uVar28 >> 3,0);
          auVar72._12_4_ = (uint)bVar10 * auVar45._12_4_ | (uint)!bVar10 * 0x7f800000;
          stack_node[0x1f1].ptr = auVar72._0_8_;
          stack_node[0x1f2].ptr = auVar72._8_8_;
          auVar137 = ZEXT3264(auVar96);
          pNVar25 = stack_node + 0x229;
          stack_node[0x223].ptr = auVar74._0_8_;
          stack_node[0x224].ptr = auVar74._8_8_;
          stack_node[0x225].ptr = auVar74._16_8_;
          stack_node[0x226].ptr = auVar74._24_8_;
          stack_node[0x21f].ptr = auVar75._0_8_;
          stack_node[0x220].ptr = auVar75._8_8_;
          stack_node[0x221].ptr = auVar75._16_8_;
          stack_node[0x222].ptr = auVar75._24_8_;
          stack_node[0x21b].ptr = auVar76._0_8_;
          stack_node[0x21c].ptr = auVar76._8_8_;
          stack_node[0x21d].ptr = auVar76._16_8_;
          stack_node[0x21e].ptr = auVar76._24_8_;
          stack_node[0x217].ptr = auVar77._0_8_;
          stack_node[0x218].ptr = auVar77._8_8_;
          stack_node[0x219].ptr = auVar77._16_8_;
          stack_node[0x21a].ptr = auVar77._24_8_;
          stack_node[0x213].ptr = auVar78._0_8_;
          stack_node[0x214].ptr = auVar78._8_8_;
          stack_node[0x215].ptr = auVar78._16_8_;
          stack_node[0x216].ptr = auVar78._24_8_;
          stack_node[0x20f].ptr = auVar79._0_8_;
          stack_node[0x210].ptr = auVar79._8_8_;
          stack_node[0x211].ptr = auVar79._16_8_;
          stack_node[0x212].ptr = auVar79._24_8_;
          stack_node[0x20b].ptr = auVar80._0_8_;
          stack_node[0x20c].ptr = auVar80._8_8_;
          stack_node[0x20d].ptr = auVar80._16_8_;
          stack_node[0x20e].ptr = auVar80._24_8_;
          stack_node[0x207].ptr = auVar81._0_8_;
          stack_node[0x208].ptr = auVar81._8_8_;
          stack_node[0x209].ptr = auVar81._16_8_;
          stack_node[0x20a].ptr = auVar81._24_8_;
          stack_node[0x203].ptr = auVar82._0_8_;
          stack_node[0x204].ptr = auVar82._8_8_;
          stack_node[0x205].ptr = auVar82._16_8_;
          stack_node[0x206].ptr = auVar82._24_8_;
          stack_node[0x1ff].ptr = auVar83._0_8_;
          stack_node[0x200].ptr = auVar83._8_8_;
          stack_node[0x201].ptr = auVar83._16_8_;
          stack_node[0x202].ptr = auVar83._24_8_;
          stack_node[0x1fb].ptr = auVar84._0_8_;
          stack_node[0x1fc].ptr = auVar84._8_8_;
          stack_node[0x1fd].ptr = auVar84._16_8_;
          stack_node[0x1fe].ptr = auVar84._24_8_;
          stack_node[0x1f7].ptr = auVar85._0_8_;
          stack_node[0x1f8].ptr = auVar85._8_8_;
          stack_node[0x1f9].ptr = auVar85._16_8_;
          stack_node[0x1fa].ptr = auVar85._24_8_;
          stack_node[499].ptr = uVar93;
          stack_node[500].ptr = auVar150._8_8_;
          stack_node[0x1f5].ptr = auVar96._16_8_;
          stack_node[0x1f6].ptr = auVar96._24_8_;
LAB_0086475d:
          auVar45 = in_ZMM18._0_16_;
          auVar43 = auVar138._0_16_;
          auVar85 = vbroadcastss_avx512vl(auVar43);
          while (pNVar25 != stack_node + 0x227) {
            uVar123 = (undefined4)pNVar25[-1].ptr;
            auVar95._4_4_ = uVar123;
            auVar95._0_4_ = uVar123;
            auVar95._8_4_ = uVar123;
            auVar95._12_4_ = uVar123;
            auVar97 = ZEXT1664(auVar95);
            pNVar25 = pNVar25 + -2;
            uVar16 = vcmpps_avx512vl(auVar95,auVar45,1);
            if ((char)uVar16 != '\0') {
              sVar30 = pNVar25->ptr;
              do {
                if ((sVar30 & 8) != 0) {
                  uVar16 = vcmpps_avx512vl(auVar45,auVar97._0_16_,6);
                  stack_node[0x1c7].ptr._0_1_ = (char)uVar16;
                  if ((char)uVar16 != '\0') {
                    stack_node[0x1ed].ptr = auVar43._0_8_;
                    stack_node[0x1ee].ptr = auVar43._8_8_;
                    stack_node[0x1ef].ptr = auVar45._0_8_;
                    stack_node[0x1f0].ptr = auVar45._8_8_;
                    stack_node[0x1d1].ptr = (ulong)((uint)sVar30 & 0xf) - 8;
                    if (stack_node[0x1d1].ptr != 0) {
                      pPVar29 = (Primitive_conflict4 *)(sVar30 & 0xfffffffffffffff0);
                      do {
                        stack_node[0x1c2].ptr = 0x864a86;
                        InstanceArrayIntersectorK<4>::intersect
                                  ((vbool<4>_conflict *)(stack_node + 0x1c7),
                                   (Precalculations *)((long)&stack_node[0x1c4].ptr + 7),ray,context
                                   ,pPVar29);
                        pPVar29 = pPVar29 + 1;
                        stack_node[0x1d1].ptr = stack_node[0x1d1].ptr - 1;
                        context = (RayQueryContext *)stack_node[0x1d0];
                        ray = (RayHitK<4> *)stack_node[0x1cf];
                      } while (stack_node[0x1d1].ptr != 0);
                    }
                    auVar45 = *(undefined1 (*) [16])(ray + 0x80);
                    uVar16 = vcmpps_avx512vl(auVar45,stack_node._3960_16_,1);
                    if (((byte)stack_node[0x1c7].ptr & (byte)uVar16) == 0) {
                      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                      stack_node[0x1c2].ptr = 8;
                    }
                    else {
                      auVar73._0_4_ =
                           (uint)((byte)stack_node[0x1c7].ptr & 1) * auVar45._0_4_ |
                           (uint)!(bool)((byte)stack_node[0x1c7].ptr & 1) *
                           (int)stack_node[0x1ef].ptr;
                      bVar10 = (bool)((byte)stack_node[0x1c7].ptr >> 1 & 1);
                      auVar73._4_4_ =
                           (uint)bVar10 * auVar45._4_4_ |
                           (uint)!bVar10 * stack_node[0x1ef].ptr._4_4_;
                      bVar10 = (bool)((byte)stack_node[0x1c7].ptr >> 2 & 1);
                      auVar73._8_4_ =
                           (uint)bVar10 * auVar45._8_4_ | (uint)!bVar10 * (int)stack_node[0x1f0].ptr
                      ;
                      bVar10 = (bool)((byte)stack_node[0x1c7].ptr >> 3 & 1);
                      auVar73._12_4_ =
                           (uint)bVar10 * auVar45._12_4_ |
                           (uint)!bVar10 * stack_node[0x1f0].ptr._4_4_;
                      auVar45 = vshufps_avx512vl(auVar73,auVar73,0xb1);
                      auVar43 = vmaxps_avx512vl(auVar45,auVar73);
                      auVar45 = vshufpd_avx(auVar43,auVar43,1);
                      stack_node._3944_16_ = vmaxss_avx512f(auVar45,auVar43);
                      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                      stack_node[0x1c2].ptr = 8;
                      stack_node._3960_16_ = auVar73;
                    }
                    auVar138 = ZEXT1664(stack_node._3944_16_);
                    in_ZMM18 = ZEXT1664(stack_node._3960_16_);
                    auVar135 = ZEXT1664(auVar45);
                    auVar131 = ZEXT1664(stack_node._3752_16_);
                    auVar129 = ZEXT1664(stack_node._3768_16_);
                    auVar127 = ZEXT1664(stack_node._3784_16_);
                    auVar126 = ZEXT1664(stack_node._3800_16_);
                    auVar125 = ZEXT1664(stack_node._3816_16_);
                    auVar124 = ZEXT1664(stack_node._3832_16_);
                    auVar91 = ZEXT3264(stack_node._4376_32_);
                    auVar139 = ZEXT3264(stack_node._4344_32_);
                    auVar140 = ZEXT3264(stack_node._4312_32_);
                    auVar141 = ZEXT3264(stack_node._4280_32_);
                    auVar142 = ZEXT3264(stack_node._4248_32_);
                    auVar143 = ZEXT3264(stack_node._4216_32_);
                    auVar144 = ZEXT3264(stack_node._4184_32_);
                    auVar145 = ZEXT3264(stack_node._4152_32_);
                    auVar146 = ZEXT3264(stack_node._4120_32_);
                    auVar147 = ZEXT3264(stack_node._4088_32_);
                    auVar148 = ZEXT3264(stack_node._4056_32_);
                    auVar149 = ZEXT3264(stack_node._4024_32_);
                    auVar137 = ZEXT3264(stack_node._3992_32_);
                  }
                  goto LAB_0086475d;
                }
                auVar74 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])(sVar30 + 0x40 + stack_node[0x1d2].ptr),
                                     auVar139._0_32_,auVar91._0_32_);
                auVar75 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])(sVar30 + 0x40 + stack_node[0x1d4].ptr),
                                     auVar141._0_32_,auVar140._0_32_);
                auVar74 = vpmaxsd_avx2(auVar74,auVar75);
                auVar75 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])(sVar30 + 0x40 + uVar36),auVar143._0_32_,
                                     auVar142._0_32_);
                auVar75 = vpmaxsd_avx2(auVar75,auVar137._0_32_);
                auVar74 = vpmaxsd_avx2(auVar74,auVar75);
                auVar75 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])(sVar30 + 0x40 + (uVar35 ^ 0x20)),
                                     auVar145._0_32_,auVar144._0_32_);
                auVar76 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])(sVar30 + 0x40 + stack_node[0x1d3].ptr),
                                     auVar147._0_32_,auVar146._0_32_);
                auVar75 = vpminsd_avx2(auVar75,auVar76);
                auVar76 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])(sVar30 + 0x40 + (uVar36 ^ 0x20)),
                                     auVar149._0_32_,auVar148._0_32_);
                auVar76 = vpminsd_avx2(auVar76,auVar85);
                auVar75 = vpminsd_avx2(auVar75,auVar76);
                stack_node[0x1c7].ptr = auVar74._0_8_;
                stack_node[0x1c8].ptr = auVar74._8_8_;
                stack_node[0x1c9].ptr = auVar74._16_8_;
                stack_node[0x1ca].ptr = auVar74._24_8_;
                uVar28 = vcmpps_avx512vl(auVar74,auVar75,2);
                if ((char)uVar28 == '\0') {
                  bVar10 = false;
                  sVar23 = sVar30;
                }
                else {
                  auVar97 = ZEXT1664(auVar135._0_16_);
                  uVar27 = 0;
                  sVar22 = 8;
                  do {
                    lVar24 = 0;
                    for (uVar17 = uVar28; (uVar17 & 1) == 0;
                        uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                      lVar24 = lVar24 + 1;
                    }
                    uVar123 = *(undefined4 *)(sVar30 + 0x40 + lVar24 * 4);
                    auVar105._4_4_ = uVar123;
                    auVar105._0_4_ = uVar123;
                    auVar105._8_4_ = uVar123;
                    auVar105._12_4_ = uVar123;
                    auVar39 = vfmadd132ps_fma(auVar105,auVar127._0_16_,auVar125._0_16_);
                    uVar123 = *(undefined4 *)(sVar30 + 0x80 + lVar24 * 4);
                    auVar110._4_4_ = uVar123;
                    auVar110._0_4_ = uVar123;
                    auVar110._8_4_ = uVar123;
                    auVar110._12_4_ = uVar123;
                    auVar41 = vfmadd132ps_fma(auVar110,auVar129._0_16_,auVar124._0_16_);
                    uVar123 = *(undefined4 *)(sVar30 + 0xc0 + lVar24 * 4);
                    auVar114._4_4_ = uVar123;
                    auVar114._0_4_ = uVar123;
                    auVar114._8_4_ = uVar123;
                    auVar114._12_4_ = uVar123;
                    auVar50 = vfmadd132ps_avx512vl(auVar114,auVar131._0_16_,auVar126._0_16_);
                    uVar123 = *(undefined4 *)(sVar30 + 0x60 + lVar24 * 4);
                    auVar116._4_4_ = uVar123;
                    auVar116._0_4_ = uVar123;
                    auVar116._8_4_ = uVar123;
                    auVar116._12_4_ = uVar123;
                    auVar52 = vfmadd132ps_fma(auVar116,auVar127._0_16_,auVar125._0_16_);
                    uVar123 = *(undefined4 *)(sVar30 + 0xa0 + lVar24 * 4);
                    auVar119._4_4_ = uVar123;
                    auVar119._0_4_ = uVar123;
                    auVar119._8_4_ = uVar123;
                    auVar119._12_4_ = uVar123;
                    auVar53 = vfmadd132ps_fma(auVar119,auVar129._0_16_,auVar124._0_16_);
                    uVar123 = *(undefined4 *)(sVar30 + 0xe0 + lVar24 * 4);
                    auVar122._4_4_ = uVar123;
                    auVar122._0_4_ = uVar123;
                    auVar122._8_4_ = uVar123;
                    auVar122._12_4_ = uVar123;
                    auVar67 = vfmadd132ps_avx512vl(auVar122,auVar131._0_16_,auVar126._0_16_);
                    auVar54 = vpminsd_avx(auVar39,auVar52);
                    auVar44 = vpminsd_avx(auVar41,auVar53);
                    auVar54 = vpmaxsd_avx(auVar54,auVar44);
                    auVar44 = vpminsd_avx(auVar50,auVar67);
                    auVar44 = vpmaxsd_avx(auVar44,stack_node._3976_16_);
                    auVar54 = vpmaxsd_avx(auVar54,auVar44);
                    auVar44 = vpmaxsd_avx(auVar39,auVar52);
                    auVar39 = vpmaxsd_avx(auVar41,auVar53);
                    auVar39 = vpminsd_avx(auVar44,auVar39);
                    auVar44 = vpmaxsd_avx(auVar50,auVar67);
                    auVar44 = vpminsd_avx512vl(auVar44,auVar45);
                    auVar44 = vpminsd_avx(auVar39,auVar44);
                    uVar17 = vpcmpd_avx512vl(auVar54,auVar44,2);
                    sVar23 = sVar22;
                    if ((uVar17 & 0xf) != 0) {
                      uVar123 = *(undefined4 *)((long)&stack_node[0x1c7].ptr + lVar24 * 4);
                      auVar106._4_4_ = uVar123;
                      auVar106._0_4_ = uVar123;
                      auVar106._8_4_ = uVar123;
                      auVar106._12_4_ = uVar123;
                      sVar23 = *(size_t *)(sVar30 + lVar24 * 8);
                      auVar54 = auVar97._0_16_;
                      uVar16 = vcmpps_avx512vl(auVar106,auVar54,1);
                      if ((char)uVar16 == '\0') {
                        pNVar25->ptr = sVar23;
                        sVar23 = sVar22;
                      }
                      else {
                        if (sVar22 == 8) {
                          auVar97 = ZEXT1664(auVar106);
                          goto LAB_0086493c;
                        }
                        pNVar25->ptr = sVar22;
                        auVar97 = ZEXT1664(auVar106);
                        auVar106 = auVar54;
                      }
                      uVar27 = uVar27 + 1;
                      *(int *)&pNVar25[1].ptr = auVar106._0_4_;
                      pNVar25 = pNVar25 + 2;
                    }
LAB_0086493c:
                    uVar28 = uVar28 - 1 & uVar28;
                    sVar22 = sVar23;
                  } while (uVar28 != 0);
                  if (sVar23 == 8) {
                    bVar10 = false;
                  }
                  else {
                    bVar10 = true;
                    if (1 < uVar27) {
                      pNVar5 = pNVar25 + -4;
                      pNVar6 = pNVar25 + -2;
                      if ((uint)pNVar25[-3].ptr < (uint)pNVar25[-1].ptr) {
                        stack_node[0x1c5].ptr = pNVar5->ptr;
                        stack_node[0x1c6].ptr = pNVar25[-3].ptr;
                        NVar21.ptr = stack_node[0x1c6].ptr;
                        *(int *)&pNVar25[-3].ptr = (int)pNVar25[-1].ptr;
                        pNVar5->ptr = pNVar6->ptr;
                        pNVar6->ptr = stack_node[0x1c5].ptr;
                        *(undefined4 *)&pNVar25[-1].ptr = (undefined4)stack_node[0x1c6].ptr;
                        stack_node[0x1c6].ptr = NVar21.ptr;
                      }
                      stack_node[0x1c2].ptr = 8;
                      if (uVar27 != 2) {
                        pNVar7 = pNVar25 + -6;
                        if ((uint)pNVar25[-5].ptr < (uint)pNVar25[-1].ptr) {
                          stack_node[0x1c5].ptr = pNVar7->ptr;
                          stack_node[0x1c6].ptr = pNVar25[-5].ptr;
                          NVar21.ptr = stack_node[0x1c6].ptr;
                          *(int *)&pNVar25[-5].ptr = (int)pNVar25[-1].ptr;
                          pNVar7->ptr = pNVar6->ptr;
                          pNVar6->ptr = stack_node[0x1c5].ptr;
                          *(undefined4 *)&pNVar25[-1].ptr = (undefined4)stack_node[0x1c6].ptr;
                          stack_node[0x1c6].ptr = NVar21.ptr;
                        }
                        stack_node[0x1c2].ptr = 8;
                        if ((uint)pNVar25[-5].ptr < (uint)pNVar25[-3].ptr) {
                          stack_node[0x1c5].ptr = pNVar7->ptr;
                          stack_node[0x1c6].ptr = pNVar25[-5].ptr;
                          NVar21.ptr = stack_node[0x1c6].ptr;
                          *(int *)&pNVar25[-5].ptr = (int)pNVar25[-3].ptr;
                          pNVar7->ptr = pNVar5->ptr;
                          pNVar5->ptr = stack_node[0x1c5].ptr;
                          *(undefined4 *)&pNVar25[-3].ptr = (undefined4)stack_node[0x1c6].ptr;
                          stack_node[0x1c6].ptr = NVar21.ptr;
                        }
                      }
                    }
                  }
                }
                sVar30 = sVar23;
              } while (bVar10);
            }
          }
        } while (stack_node[0x1ce].ptr != 0);
      }
      return;
    }
    auVar45 = vpcmpeqd_avx(auVar45,auVar45);
    uVar35 = vpcmpeqd_avx512vl(auVar45,(undefined1  [16])valid_i->field_0);
    uVar35 = uVar35 & 0xf;
    bVar33 = (byte)uVar35;
    if (bVar33 != 0) {
      auVar45 = *(undefined1 (*) [16])(ray + 0x40);
      auVar43 = *(undefined1 (*) [16])(ray + 0x50);
      auVar54 = *(undefined1 (*) [16])(ray + 0x60);
      auVar103._8_4_ = 0x7fffffff;
      auVar103._0_8_ = 0x7fffffff7fffffff;
      auVar103._12_4_ = 0x7fffffff;
      auVar44 = vandps_avx(auVar54,auVar103);
      auVar112._8_4_ = 0x219392ef;
      auVar112._0_8_ = 0x219392ef219392ef;
      auVar112._12_4_ = 0x219392ef;
      uVar28 = vcmpps_avx512vl(auVar44,auVar112,1);
      bVar10 = (bool)((byte)uVar28 & 1);
      auVar38._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar54._0_4_;
      bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar54._4_4_;
      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar54._8_4_;
      bVar10 = (bool)((byte)(uVar28 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar54._12_4_;
      auVar39 = vrcp14ps_avx512vl(auVar38);
      auVar117._8_4_ = 0x3f800000;
      auVar117._0_8_ = &DAT_3f8000003f800000;
      auVar117._12_4_ = 0x3f800000;
      auVar44 = vfnmadd213ps_fma(auVar38,auVar39,auVar117);
      auVar54 = vandps_avx(auVar43,auVar103);
      uVar28 = vcmpps_avx512vl(auVar54,auVar112,1);
      bVar10 = (bool)((byte)uVar28 & 1);
      auVar40._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._0_4_;
      bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
      auVar40._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._4_4_;
      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
      auVar40._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._8_4_;
      bVar10 = (bool)((byte)(uVar28 >> 3) & 1);
      auVar40._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar43._12_4_;
      auVar41 = vrcp14ps_avx512vl(auVar40);
      auVar54 = vfnmadd213ps_fma(auVar40,auVar41,auVar117);
      auVar43 = vandps_avx(auVar45,auVar103);
      uVar28 = vcmpps_avx512vl(auVar43,auVar112,1);
      bVar10 = (bool)((byte)uVar28 & 1);
      auVar42._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar45._0_4_;
      bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar45._4_4_;
      bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar45._8_4_;
      bVar10 = (bool)((byte)(uVar28 >> 3) & 1);
      auVar42._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar45._12_4_;
      auVar43 = vrcp14ps_avx512vl(auVar42);
      auVar45 = vfnmadd213ps_fma(auVar42,auVar43,auVar117);
      auVar45 = vfmadd132ps_fma(auVar45,auVar43,auVar43);
      auVar124 = ZEXT1664(auVar45);
      auVar43 = vfmadd132ps_fma(auVar54,auVar41,auVar41);
      auVar125 = ZEXT1664(auVar43);
      auVar54 = vfmadd132ps_fma(auVar44,auVar39,auVar39);
      auVar126 = ZEXT1664(auVar54);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar127 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar44 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[1].field_0._0_4_ =
           (uint)(bVar33 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar33 & 1) * 0x7f800000;
      bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
      stack_near[1].field_0._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * 0x7f800000;
      bVar10 = (bool)((byte)(uVar35 >> 2) & 1);
      stack_near[1].field_0._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * 0x7f800000;
      bVar10 = SUB81(uVar35 >> 3,0);
      stack_near[1].field_0._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * 0x7f800000;
      auVar129 = ZEXT1664((undefined1  [16])stack_near[1].field_0);
      auVar44 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40);
      bVar10 = (bool)((byte)(uVar35 >> 1) & 1);
      bVar32 = (bool)((byte)(uVar35 >> 2) & 1);
      bVar12 = SUB81(uVar35 >> 3,0);
      auVar131 = ZEXT1664(CONCAT412((uint)bVar12 * auVar44._12_4_ | (uint)!bVar12 * -0x800000,
                                    CONCAT48((uint)bVar32 * auVar44._8_4_ |
                                             (uint)!bVar32 * -0x800000,
                                             CONCAT44((uint)bVar10 * auVar44._4_4_ |
                                                      (uint)!bVar10 * -0x800000,
                                                      (uint)(bVar33 & 1) * auVar44._0_4_ |
                                                      (uint)!(bool)(bVar33 & 1) * -0x800000))));
      pNVar25 = stack_node + 2;
      paVar31 = &stack_near[2].field_0;
      auVar135 = ZEXT1664(CONCAT412(auVar45._12_4_ * -*(float *)(ray + 0xc),
                                    CONCAT48(auVar45._8_4_ * -*(float *)(ray + 8),
                                             CONCAT44(auVar45._4_4_ * -*(float *)(ray + 4),
                                                      auVar45._0_4_ * -*(float *)ray))));
      auVar45 = *(undefined1 (*) [16])(ray + 0x10);
      auVar94._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
      auVar94._8_4_ = auVar45._8_4_ ^ 0x80000000;
      auVar94._12_4_ = auVar45._12_4_ ^ 0x80000000;
      auVar45 = *(undefined1 (*) [16])(ray + 0x20);
      auVar87._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
      auVar87._8_4_ = auVar45._8_4_ ^ 0x80000000;
      auVar87._12_4_ = auVar45._12_4_ ^ 0x80000000;
      auVar45 = vmulps_avx512vl(auVar43,auVar94);
      auVar137 = ZEXT1664(auVar45);
      auVar45 = vmulps_avx512vl(auVar54,auVar87);
      auVar138 = ZEXT1664(auVar45);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      do {
        auVar43 = auVar138._0_16_;
        auVar45 = auVar137._0_16_;
        paVar31 = paVar31 + -1;
        pNVar5 = pNVar25 + -1;
        pNVar25 = pNVar25 + -1;
        bVar10 = true;
        if (pNVar5->ptr != 0xfffffffffffffff8) {
          auVar91 = ZEXT1664((undefined1  [16])*paVar31);
          auVar54 = auVar131._0_16_;
          uVar16 = vcmpps_avx512vl((undefined1  [16])*paVar31,auVar54,1);
          sVar30 = pNVar5->ptr;
          if ((char)uVar16 != '\0') {
            do {
              auVar44 = auVar124._0_16_;
              auVar52 = auVar135._0_16_;
              auVar39 = auVar125._0_16_;
              auVar41 = auVar126._0_16_;
              if ((sVar30 & 8) != 0) {
                if (sVar30 == 0xfffffffffffffff8) goto LAB_00827734;
                uVar16 = vcmpps_avx512vl(auVar54,auVar91._0_16_,6);
                valid_leaf.v = (__mmask8)uVar16;
                if (valid_leaf.v != '\0') {
                  lVar24 = (ulong)((uint)sVar30 & 0xf) - 8;
                  if (lVar24 != 0) {
                    pPVar29 = (Primitive_conflict4 *)(sVar30 & 0xfffffffffffffff0);
                    do {
                      InstanceArrayIntersectorK<4>::intersect(&valid_leaf,&pre,ray,context,pPVar29);
                      pPVar29 = pPVar29 + 1;
                      lVar24 = lVar24 + -1;
                    } while (lVar24 != 0);
                  }
                  local_3528 = auVar131._0_4_;
                  iStack_3524 = auVar131._4_4_;
                  iStack_3520 = auVar131._8_4_;
                  iStack_351c = auVar131._12_4_;
                  bVar10 = (bool)(valid_leaf.v >> 1 & 1);
                  bVar32 = (bool)(valid_leaf.v >> 2 & 1);
                  bVar12 = (bool)(valid_leaf.v >> 3 & 1);
                  auVar131 = ZEXT1664(CONCAT412((uint)bVar12 * *(int *)(ray + 0x8c) |
                                                (uint)!bVar12 * iStack_351c,
                                                CONCAT48((uint)bVar32 * *(int *)(ray + 0x88) |
                                                         (uint)!bVar32 * iStack_3520,
                                                         CONCAT44((uint)bVar10 *
                                                                  *(int *)(ray + 0x84) |
                                                                  (uint)!bVar10 * iStack_3524,
                                                                  (uint)(valid_leaf.v & 1) *
                                                                  *(int *)(ray + 0x80) |
                                                                  (uint)!(bool)(valid_leaf.v & 1) *
                                                                  local_3528))));
                  auVar124 = ZEXT1664(auVar44);
                  auVar125 = ZEXT1664(auVar39);
                  auVar126 = ZEXT1664(auVar41);
                  auVar127 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  auVar129 = ZEXT1664(auVar129._0_16_);
                  auVar135 = ZEXT1664(auVar52);
                  auVar137 = ZEXT1664(auVar45);
                  auVar138 = ZEXT1664(auVar43);
                }
                break;
              }
              uVar28 = 0;
              auVar91 = ZEXT1664(auVar127._0_16_);
              uVar35 = 0;
              sVar23 = 8;
              do {
                sVar22 = *(size_t *)((sVar30 & 0xfffffffffffffff0) + uVar35 * 8);
                if (sVar22 != 8) {
                  uVar123 = *(undefined4 *)(sVar30 + 0x40 + uVar35 * 4);
                  auVar104._4_4_ = uVar123;
                  auVar104._0_4_ = uVar123;
                  auVar104._8_4_ = uVar123;
                  auVar104._12_4_ = uVar123;
                  auVar67 = vfmadd132ps_fma(auVar104,auVar52,auVar44);
                  uVar123 = *(undefined4 *)(sVar30 + 0x80 + uVar35 * 4);
                  auVar109._4_4_ = uVar123;
                  auVar109._0_4_ = uVar123;
                  auVar109._8_4_ = uVar123;
                  auVar109._12_4_ = uVar123;
                  auVar46 = vfmadd132ps_avx512vl(auVar109,auVar45,auVar39);
                  uVar123 = *(undefined4 *)(sVar30 + 0xc0 + uVar35 * 4);
                  auVar113._4_4_ = uVar123;
                  auVar113._0_4_ = uVar123;
                  auVar113._8_4_ = uVar123;
                  auVar113._12_4_ = uVar123;
                  auVar47 = vfmadd132ps_avx512vl(auVar113,auVar43,auVar41);
                  uVar123 = *(undefined4 *)(sVar30 + 0x60 + uVar35 * 4);
                  auVar115._4_4_ = uVar123;
                  auVar115._0_4_ = uVar123;
                  auVar115._8_4_ = uVar123;
                  auVar115._12_4_ = uVar123;
                  auVar69 = vfmadd132ps_fma(auVar115,auVar52,auVar44);
                  uVar123 = *(undefined4 *)(sVar30 + 0xa0 + uVar35 * 4);
                  auVar118._4_4_ = uVar123;
                  auVar118._0_4_ = uVar123;
                  auVar118._8_4_ = uVar123;
                  auVar118._12_4_ = uVar123;
                  auVar48 = vfmadd132ps_avx512vl(auVar118,auVar45,auVar39);
                  uVar123 = *(undefined4 *)(sVar30 + 0xe0 + uVar35 * 4);
                  auVar121._4_4_ = uVar123;
                  auVar121._0_4_ = uVar123;
                  auVar121._8_4_ = uVar123;
                  auVar121._12_4_ = uVar123;
                  auVar49 = vfmadd132ps_avx512vl(auVar121,auVar43,auVar41);
                  auVar53 = vpminsd_avx(auVar67,auVar69);
                  auVar50 = vpminsd_avx(auVar46,auVar48);
                  auVar53 = vpmaxsd_avx(auVar53,auVar50);
                  auVar50 = vpminsd_avx(auVar47,auVar49);
                  auVar53 = vpmaxsd_avx(auVar53,auVar50);
                  auVar50 = vpmaxsd_avx(auVar67,auVar69);
                  auVar67 = vpmaxsd_avx(auVar46,auVar48);
                  auVar69 = vpminsd_avx(auVar50,auVar67);
                  auVar50 = vpmaxsd_avx(auVar47,auVar49);
                  auVar67 = vpmaxsd_avx(auVar53,auVar129._0_16_);
                  auVar50 = vpminsd_avx(auVar50,auVar54);
                  auVar50 = vpminsd_avx(auVar69,auVar50);
                  uVar36 = vpcmpd_avx512vl(auVar67,auVar50,2);
                  uVar36 = uVar36 & 0xf;
                  if ((byte)uVar36 != 0) {
                    auVar50 = vblendmps_avx512vl(auVar127._0_16_,auVar53);
                    bVar32 = (bool)((byte)uVar36 & 1);
                    aVar51._0_4_ = (uint)bVar32 * auVar50._0_4_ | (uint)!bVar32 * auVar53._0_4_;
                    bVar32 = (bool)((byte)(uVar36 >> 1) & 1);
                    aVar51._4_4_ = (uint)bVar32 * auVar50._4_4_ | (uint)!bVar32 * auVar53._4_4_;
                    bVar32 = (bool)((byte)(uVar36 >> 2) & 1);
                    aVar51._8_4_ = (uint)bVar32 * auVar50._8_4_ | (uint)!bVar32 * auVar53._8_4_;
                    bVar32 = SUB81(uVar36 >> 3,0);
                    aVar51._12_4_ = (uint)bVar32 * auVar50._12_4_ | (uint)!bVar32 * auVar53._12_4_;
                    aVar88 = auVar91._0_16_;
                    uVar16 = vcmpps_avx512vl((undefined1  [16])aVar51,(undefined1  [16])aVar88,1);
                    sVar26 = sVar22;
                    aVar9 = aVar88;
                    aVar20 = aVar51;
                    if (((char)uVar16 == '\0') ||
                       (bVar32 = sVar23 != 8, sVar26 = sVar23, sVar23 = sVar22, aVar9 = aVar51,
                       aVar20 = aVar88, bVar32)) {
                      uVar28 = uVar28 + 1;
                      pNVar25->ptr = sVar26;
                      pNVar25 = pNVar25 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar31->v = aVar20;
                      paVar31 = paVar31 + 1;
                      auVar91 = ZEXT1664((undefined1  [16])aVar9);
                    }
                    else {
                      auVar91 = ZEXT1664((undefined1  [16])aVar51);
                    }
                  }
                }
              } while ((sVar22 != 8) && (bVar32 = uVar35 < 7, uVar35 = uVar35 + 1, bVar32));
              if (1 < uVar28 && sVar23 != 8) {
                aVar9 = paVar31[-2];
                uVar16 = vcmpps_avx512vl((undefined1  [16])aVar9,(undefined1  [16])paVar31[-1],1);
                if ((char)uVar16 != '\0') {
                  paVar31[-2] = paVar31[-1];
                  paVar31[-1] = aVar9;
                  auVar44 = vpermilps_avx(*(undefined1 (*) [16])(pNVar25 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar25 + -2) = auVar44;
                }
                if (uVar28 != 2) {
                  aVar9 = paVar31[-3];
                  uVar16 = vcmpps_avx512vl((undefined1  [16])aVar9,(undefined1  [16])paVar31[-1],1);
                  if ((char)uVar16 != '\0') {
                    paVar31[-3] = paVar31[-1];
                    paVar31[-1] = aVar9;
                    sVar30 = pNVar25[-3].ptr;
                    pNVar25[-3].ptr = pNVar25[-1].ptr;
                    pNVar25[-1].ptr = sVar30;
                  }
                  aVar9 = paVar31[-3];
                  uVar16 = vcmpps_avx512vl((undefined1  [16])aVar9,(undefined1  [16])paVar31[-2],1);
                  if ((char)uVar16 != '\0') {
                    paVar31[-3] = paVar31[-2];
                    paVar31[-2] = aVar9;
                    auVar44 = vpermilps_avx(*(undefined1 (*) [16])(pNVar25 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar25 + -3) = auVar44;
                  }
                }
              }
              sVar30 = sVar23;
            } while (sVar23 != 8);
          }
          bVar10 = false;
        }
LAB_00827734:
      } while (!bVar10);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }